

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

void __thiscall
icu_63::CollationRuleParser::parseStarredCharacters
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  short sVar1;
  Sink *pSVar2;
  UnicodeString *pUVar3;
  int32_t iVar4;
  undefined4 uVar5;
  uint ch;
  int iVar6;
  uint uVar7;
  char16_t *pcVar8;
  char *pcVar9;
  uint uVar10;
  UnicodeString raw;
  UnicodeString s;
  UnicodeString empty;
  uint local_114;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar4 = skipWhiteSpace(this,i);
  local_114 = parseString(this,iVar4,&local_f0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0x1f < (ushort)local_f0.fUnion.fStackFields.fLengthAndFlags) {
      iVar4 = 0;
      do {
        uVar5 = local_f0.fUnion.fFields.fLength;
        if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        ch = 0xffffffff;
        for (; iVar4 < (int)uVar5; iVar4 = (iVar4 - (uint)(ch < 0x10000)) + 2) {
          ch = UnicodeString::char32At(&local_f0,iVar4);
          iVar6 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,(ulong)ch);
          if ((char)iVar6 == '\0') {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              this->errorReason = "starred-relation string is not all NFD-inert";
              if (this->parseError != (UParseError *)0x0) {
LAB_00235414:
                setErrorContext(this);
              }
            }
            goto LAB_00235128;
          }
          pSVar2 = this->sink;
          UnicodeString::UnicodeString(&local_b0,ch);
          (*(pSVar2->super_UObject)._vptr_UObject[4])
                    (pSVar2,(ulong)(uint)strength,&local_70,&local_b0,&local_70,&this->errorReason,
                     errorCode);
          UnicodeString::~UnicodeString(&local_b0);
          if (U_ZERO_ERROR < *errorCode) goto LAB_00235414;
          uVar5 = local_f0.fUnion.fFields.fLength;
          if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
            uVar5 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
        }
        pUVar3 = this->rules;
        sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar7 = (pUVar3->fUnion).fFields.fLength;
        }
        else {
          uVar7 = (int)sVar1 >> 5;
        }
        if (uVar7 <= local_114 || (int)uVar7 <= (int)local_114) {
LAB_00235483:
          iVar4 = skipWhiteSpace(this,local_114);
          this->ruleIndex = iVar4;
          goto LAB_00235128;
        }
        if (((int)sVar1 & 2U) == 0) {
          pcVar8 = (pUVar3->fUnion).fFields.fArray;
        }
        else {
          pcVar8 = (char16_t *)((long)&pUVar3->fUnion + 2);
        }
        if (pcVar8[(int)local_114] != L'-') goto LAB_00235483;
        if ((int)ch < 0) {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            pcVar9 = "range without start in starred-relation string";
LAB_002354bf:
            this->errorReason = pcVar9;
            if (this->parseError != (UParseError *)0x0) {
              setErrorContext(this);
            }
          }
          goto LAB_00235128;
        }
        local_114 = parseString(this,local_114 + 1,&local_f0,errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_00235128;
        if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          pcVar9 = "range without end in starred-relation string";
          goto LAB_002354bf;
        }
        uVar7 = UnicodeString::char32At(&local_f0,0);
        if ((int)uVar7 < (int)ch) {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            this->errorReason = "range start greater than end in starred-relation string";
            if (this->parseError != (UParseError *)0x0) {
              setErrorContext(this);
            }
          }
          goto LAB_00235128;
        }
        local_b0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003b2258;
        local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
        uVar10 = ch;
        while (ch = ch + 1, ch - uVar7 != 1) {
          iVar6 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])();
          if ((char)iVar6 == '\0') {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar9 = "starred-relation string range is not all NFD-inert";
LAB_00235461:
              this->errorReason = pcVar9;
              if (this->parseError == (UParseError *)0x0) goto LAB_00235474;
              goto LAB_0023546c;
            }
            goto LAB_00235474;
          }
          if ((ch & 0x7ffff800) == 0xd800) {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar9 = "starred-relation string range contains a surrogate";
              goto LAB_00235461;
            }
            goto LAB_00235474;
          }
          if (uVar10 - 0xfffc < 3) {
            if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar9 = "starred-relation string range contains U+FFFD, U+FFFE or U+FFFF";
              goto LAB_00235461;
            }
            goto LAB_00235474;
          }
          UnicodeString::unBogus(&local_b0);
          uVar5 = local_b0.fUnion.fFields.fLength;
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            uVar5 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::replace(&local_b0,0,uVar5,uVar10 + 1);
          (*(this->sink->super_UObject)._vptr_UObject[4])
                    (this->sink,(ulong)(uint)strength,&local_70,&local_b0,&local_70,
                     &this->errorReason,errorCode);
          uVar10 = uVar10 + 1;
          if (U_ZERO_ERROR < *errorCode) {
LAB_0023546c:
            setErrorContext(this);
LAB_00235474:
            UnicodeString::~UnicodeString(&local_b0);
            goto LAB_00235128;
          }
        }
        iVar4 = 2 - (uint)(uVar7 < 0x10000);
        UnicodeString::~UnicodeString(&local_b0);
      } while( true );
    }
    *errorCode = U_INVALID_FORMAT_ERROR;
    this->errorReason = "missing starred-relation string";
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
LAB_00235128:
  UnicodeString::~UnicodeString(&local_f0);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
CollationRuleParser::parseStarredCharacters(int32_t strength, int32_t i, UErrorCode &errorCode) {
    UnicodeString empty, raw;
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(raw.isEmpty()) {
        setParseError("missing starred-relation string", errorCode);
        return;
    }
    UChar32 prev = -1;
    int32_t j = 0;
    for(;;) {
        while(j < raw.length()) {
            UChar32 c = raw.char32At(j);
            if(!nfd.isInert(c)) {
                setParseError("starred-relation string is not all NFD-inert", errorCode);
                return;
            }
            sink->addRelation(strength, empty, UnicodeString(c), empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
            j += U16_LENGTH(c);
            prev = c;
        }
        if(i >= rules->length() || rules->charAt(i) != 0x2d) {  // '-'
            break;
        }
        if(prev < 0) {
            setParseError("range without start in starred-relation string", errorCode);
            return;
        }
        i = parseString(i + 1, raw, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(raw.isEmpty()) {
            setParseError("range without end in starred-relation string", errorCode);
            return;
        }
        UChar32 c = raw.char32At(0);
        if(c < prev) {
            setParseError("range start greater than end in starred-relation string", errorCode);
            return;
        }
        // range prev-c
        UnicodeString s;
        while(++prev <= c) {
            if(!nfd.isInert(prev)) {
                setParseError("starred-relation string range is not all NFD-inert", errorCode);
                return;
            }
            if(U_IS_SURROGATE(prev)) {
                setParseError("starred-relation string range contains a surrogate", errorCode);
                return;
            }
            if(0xfffd <= prev && prev <= 0xffff) {
                setParseError("starred-relation string range contains U+FFFD, U+FFFE or U+FFFF", errorCode);
                return;
            }
            s.setTo(prev);
            sink->addRelation(strength, empty, s, empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
        }
        prev = -1;
        j = U16_LENGTH(c);
    }
    ruleIndex = skipWhiteSpace(i);
}